

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

int uv_async_send(uv_async_t *handle)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *__buf;
  size_t __n;
  
  if (handle->pending == 0) {
    LOCK();
    iVar1 = handle->pending;
    if (iVar1 == 0) {
      handle->pending = 1;
      iVar1 = 0;
    }
    UNLOCK();
    if (iVar1 == 0) {
      iVar1 = handle->loop->async_wfd;
      if (iVar1 == -1) {
        iVar1 = (handle->loop->async_io_watcher).fd;
        __buf = "\x01";
        __n = 8;
      }
      else {
        __buf = "";
        __n = 1;
      }
      do {
        sVar2 = write(iVar1,__buf,__n);
        if ((int)sVar2 != -1) {
          if ((long)(int)sVar2 == __n) goto LAB_00400cf4;
          goto LAB_00400ce8;
        }
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      if (*piVar3 == 0xb) {
LAB_00400cf4:
        LOCK();
        iVar1 = handle->pending;
        if (iVar1 == 1) {
          handle->pending = 2;
          iVar1 = 1;
        }
        UNLOCK();
        if (iVar1 == 1) {
          return 0;
        }
      }
LAB_00400ce8:
      abort();
    }
  }
  return 0;
}

Assistant:

int uv_async_send(uv_async_t* handle) {
  /* Do a cheap read first. */
  if (ACCESS_ONCE(int, handle->pending) != 0)
    return 0;

  /* Tell the other thread we're busy with the handle. */
  if (cmpxchgi(&handle->pending, 0, 1) != 0)
    return 0;

  /* Wake up the other thread's event loop. */
  uv__async_send(handle->loop);

  /* Tell the other thread we're done. */
  if (cmpxchgi(&handle->pending, 1, 2) != 1)
    abort();

  return 0;
}